

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O1

bool anon_unknown.dwarf_1dad781::IsFeatureSupported
               (cmMakefile *makefile,string *linkLanguage,string *feature)

{
  bool bVar1;
  bool bVar2;
  cmValue cVar3;
  char *extraout_RDX;
  char *extraout_RDX_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string_view value;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string_view value_00;
  string featureSupported;
  string local_b8;
  string local_98;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  size_type local_68;
  pointer local_60;
  undefined8 local_58;
  char *local_50;
  size_type local_48;
  pointer local_40;
  undefined8 local_38;
  char *local_30;
  
  local_60 = (linkLanguage->_M_dataplus)._M_p;
  local_68 = linkLanguage->_M_string_length;
  local_78._M_len = 6;
  local_78._M_str = "CMAKE_";
  local_58 = 0x14;
  local_50 = "_LINK_LIBRARY_USING_";
  local_40 = (feature->_M_dataplus)._M_p;
  local_48 = feature->_M_string_length;
  local_38 = 10;
  local_30 = "_SUPPORTED";
  views._M_len = 5;
  views._M_array = &local_78;
  cmCatViews_abi_cxx11_(&local_b8,views);
  cVar3 = cmMakefile::GetDefinition(makefile,&local_b8);
  if (cVar3.Value != (string *)0x0) {
    value._M_str = extraout_RDX;
    value._M_len = (size_t)((cVar3.Value)->_M_dataplus)._M_p;
    bVar1 = cmValue::IsOn((cmValue *)(cVar3.Value)->_M_string_length,value);
    bVar2 = true;
    if (bVar1) goto LAB_0048ee14;
  }
  local_60 = (feature->_M_dataplus)._M_p;
  local_68 = feature->_M_string_length;
  local_78._M_len = 0x19;
  local_78._M_str = "CMAKE_LINK_LIBRARY_USING_";
  local_58 = 10;
  local_50 = "_SUPPORTED";
  views_00._M_len = 3;
  views_00._M_array = &local_78;
  cmCatViews_abi_cxx11_(&local_98,views_00);
  std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  cVar3 = cmMakefile::GetDefinition(makefile,&local_b8);
  if (cVar3.Value == (string *)0x0) {
    bVar2 = false;
  }
  else {
    value_00._M_str = extraout_RDX_00;
    value_00._M_len = (size_t)((cVar3.Value)->_M_dataplus)._M_p;
    bVar2 = cmValue::IsOn((cmValue *)(cVar3.Value)->_M_string_length,value_00);
  }
LAB_0048ee14:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool IsFeatureSupported(cmMakefile* makefile, std::string const& linkLanguage,
                        std::string const& feature)
{
  auto featureSupported = cmStrCat(
    "CMAKE_", linkLanguage, "_LINK_LIBRARY_USING_", feature, "_SUPPORTED");
  if (makefile->GetDefinition(featureSupported).IsOn()) {
    return true;
  }

  featureSupported =
    cmStrCat("CMAKE_LINK_LIBRARY_USING_", feature, "_SUPPORTED");
  return makefile->GetDefinition(featureSupported).IsOn();
}